

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

char * mg_set_option(mg_server *server,char *name,char *value)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ns_connection *pnVar4;
  passwd *ppVar5;
  passwd *pw;
  char buf [100];
  ns_connection *c;
  vec vec;
  char **v;
  char *error_msg;
  char *pcStack_28;
  int ind;
  char *value_local;
  char *name_local;
  mg_server *server_local;
  
  iVar1 = get_option_index(name);
  v = (char **)0x0;
  if (iVar1 < 0) {
    server_local = (mg_server *)anon_var_dwarf_6a9;
  }
  else {
    vec._8_8_ = server->config_options + iVar1;
    if (((*(char **)vec._8_8_ == (char *)0x0) && (value == (char *)0x0)) ||
       ((value != (char *)0x0 &&
        ((*(char **)vec._8_8_ != (char *)0x0 &&
         (iVar2 = strcmp(value,*(char **)vec._8_8_), iVar2 == 0)))))) {
      server_local = (mg_server *)0x0;
    }
    else {
      if (*(long *)vec._8_8_ != 0) {
        free(*(void **)vec._8_8_);
        *(undefined8 *)vec._8_8_ = 0;
      }
      if ((value == (char *)0x0) || (*value == '\0')) {
        server_local = (mg_server *)0x0;
      }
      else {
        pcVar3 = mg_strdup(value);
        *(char **)vec._8_8_ = pcVar3;
        pcStack_28 = value;
        if (iVar1 == 0xe) {
          while (pcStack_28 = next_option(pcStack_28,(vec *)&c,(vec *)0x0),
                pcStack_28 != (char *)0x0) {
            pnVar4 = ns_bind(&server->ns_mgr,(char *)c,mg_ev_handler,(void *)0x0);
            if (pnVar4 == (ns_connection *)0x0) {
              v = (char **)anon_var_dwarf_6b4;
              break;
            }
            ns_sock_to_str(pnVar4->sock,(char *)&pw,100,2);
            free(*(void **)vec._8_8_);
            pcVar3 = mg_strdup((char *)&pw);
            *(char **)vec._8_8_ = pcVar3;
          }
        }
        else if (iVar1 == 0xc) {
          (server->ns_mgr).hexdump_file = *(char **)vec._8_8_;
        }
        else if (iVar1 == 0xf) {
          ppVar5 = getpwnam(value);
          if (ppVar5 == (passwd *)0x0) {
            v = (char **)anon_var_dwarf_6bf;
          }
          else {
            iVar1 = setgid(ppVar5->pw_gid);
            if (iVar1 == 0) {
              iVar1 = setuid(ppVar5->pw_uid);
              if (iVar1 != 0) {
                v = (char **)anon_var_dwarf_6ed;
              }
            }
            else {
              v = (char **)anon_var_dwarf_6d6;
            }
          }
        }
        server_local = (mg_server *)v;
      }
    }
  }
  return (char *)server_local;
}

Assistant:

const char *mg_set_option(struct mg_server *server, const char *name,
                          const char *value) {
  int ind = get_option_index(name);
  const char *error_msg = NULL;
  char **v = NULL;

  if (ind < 0) return  "No such option";
  v = &server->config_options[ind];

  // Return success immediately if setting to the same value
  if ((*v == NULL && value == NULL) ||
      (value != NULL && *v != NULL && !strcmp(value, *v))) {
    return NULL;
  }

  if (*v != NULL) {
    free(*v);
    *v = NULL;
  }

  if (value == NULL || value[0] == '\0') return NULL;

  *v = mg_strdup(value);
  DBG(("%s [%s]", name, *v));

  if (ind == LISTENING_PORT) {
    struct vec vec;
    while ((value = next_option(value, &vec, NULL)) != NULL) {
      struct ns_connection *c = ns_bind(&server->ns_mgr, vec.ptr,
                                        mg_ev_handler, NULL);
      if (c== NULL) {
        error_msg = "Cannot bind to port";
        break;
      } else {
        char buf[100];
        ns_sock_to_str(c->sock, buf, sizeof(buf), 2);
        free(*v);
        *v = mg_strdup(buf);
      }
    }
#ifndef MONGOOSE_NO_FILESYSTEM
  } else if (ind == HEXDUMP_FILE) {
    server->ns_mgr.hexdump_file = *v;
#endif
#ifndef _WIN32
  } else if (ind == RUN_AS_USER) {
    struct passwd *pw;
    if ((pw = getpwnam(value)) == NULL) {
      error_msg = "Unknown user";
    } else if (setgid(pw->pw_gid) != 0) {
      error_msg = "setgid() failed";
    } else if (setuid(pw->pw_uid) != 0) {
      error_msg = "setuid() failed";
    }
#endif
  }

  return error_msg;
}